

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

htmlDocPtr htmlSAXParseFile(char *filename,char *encoding,htmlSAXHandlerPtr sax,void *userData)

{
  _xmlSAXHandler *p_Var1;
  htmlParserCtxtPtr ctxt;
  xmlDocPtr pxVar2;
  
  xmlInitParser();
  ctxt = htmlCreateFileParserCtxt(filename,encoding);
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    pxVar2 = (xmlDocPtr)0x0;
  }
  else {
    if (sax == (htmlSAXHandlerPtr)0x0) {
      htmlParseDocument(ctxt);
      pxVar2 = ctxt->myDoc;
    }
    else {
      p_Var1 = ctxt->sax;
      ctxt->sax = sax;
      ctxt->userData = userData;
      htmlParseDocument(ctxt);
      pxVar2 = ctxt->myDoc;
      ctxt->sax = p_Var1;
      ctxt->userData = (void *)0x0;
    }
    xmlFreeParserCtxt(ctxt);
  }
  return pxVar2;
}

Assistant:

htmlDocPtr
htmlSAXParseFile(const char *filename, const char *encoding, htmlSAXHandlerPtr sax,
                 void *userData) {
    htmlDocPtr ret;
    htmlParserCtxtPtr ctxt;
    htmlSAXHandlerPtr oldsax = NULL;

    xmlInitParser();

    ctxt = htmlCreateFileParserCtxt(filename, encoding);
    if (ctxt == NULL) return(NULL);
    if (sax != NULL) {
	oldsax = ctxt->sax;
        ctxt->sax = sax;
        ctxt->userData = userData;
    }

    htmlParseDocument(ctxt);

    ret = ctxt->myDoc;
    if (sax != NULL) {
        ctxt->sax = oldsax;
        ctxt->userData = NULL;
    }
    htmlFreeParserCtxt(ctxt);

    return(ret);
}